

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

xmlParserInputPtr xmlNewInputFromFile(xmlParserCtxtPtr ctxt,char *filename)

{
  int code;
  undefined8 in_RAX;
  xmlParserInputPtr input;
  xmlParserInputPtr local_18;
  
  local_18 = (xmlParserInputPtr)CONCAT71((int7)((ulong)in_RAX >> 8),ctxt == (xmlParserCtxtPtr)0x0);
  if (filename != (char *)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    code = xmlNewInputFromUrl(filename,((uint)ctxt->options >> 7 & 0x10 |
                                       (uint)ctxt->options >> 0x15 & 8) ^ 0x10,&local_18);
    if (code != 0) {
      xmlCtxtErrIO(ctxt,code,filename);
      local_18 = (xmlParserInputPtr)0x0;
    }
    return local_18;
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlNewInputFromFile(xmlParserCtxtPtr ctxt, const char *filename) {
    xmlParserInputPtr input;
    int flags = 0;
    int code;

    if ((ctxt == NULL) || (filename == NULL))
        return(NULL);

    if (ctxt->options & XML_PARSE_UNZIP)
        flags |= XML_INPUT_UNZIP;
    if ((ctxt->options & XML_PARSE_NONET) == 0)
        flags |= XML_INPUT_NETWORK;

    code = xmlNewInputFromUrl(filename, flags, &input);
    if (code != XML_ERR_OK) {
        xmlCtxtErrIO(ctxt, code, filename);
        return(NULL);
    }

    return(input);
}